

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O2

Request<capnproto_test::capnp::test::TestInterface::GetTestTailCalleeParams,_capnproto_test::capnp::test::TestInterface::GetTestTailCalleeResults>
* __thiscall
capnproto_test::capnp::test::TestInterface::Client::getTestTailCalleeRequest
          (Request<capnproto_test::capnp::test::TestInterface::GetTestTailCalleeParams,_capnproto_test::capnp::test::TestInterface::GetTestTailCalleeResults>
           *__return_storage_ptr__,Client *this,Maybe<capnp::MessageSize> *sizeHint)

{
  Maybe<capnp::MessageSize> local_20;
  
  local_20.ptr.isSet = (sizeHint->ptr).isSet;
  if (local_20.ptr.isSet == true) {
    local_20.ptr.field_1.value.wordCount = (sizeHint->ptr).field_1.value.wordCount;
    local_20.ptr.field_1._8_8_ = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
  }
  ::capnp::Capability::Client::
  newCall<capnproto_test::capnp::test::TestInterface::GetTestTailCalleeParams,capnproto_test::capnp::test::TestInterface::GetTestTailCalleeResults>
            (__return_storage_ptr__,
             (Client *)((long)&this->_vptr_Client + (long)this->_vptr_Client[-3]),0x88eb12a0e0af92b2
             ,4,&local_20,(CallHints)0x0);
  return __return_storage_ptr__;
}

Assistant:

::capnp::Request< ::capnproto_test::capnp::test::TestInterface::GetTestTailCalleeParams,  ::capnproto_test::capnp::test::TestInterface::GetTestTailCalleeResults>
TestInterface::Client::getTestTailCalleeRequest(::kj::Maybe< ::capnp::MessageSize> sizeHint) {
  return newCall< ::capnproto_test::capnp::test::TestInterface::GetTestTailCalleeParams,  ::capnproto_test::capnp::test::TestInterface::GetTestTailCalleeResults>(
      0x88eb12a0e0af92b2ull, 4, sizeHint, {false});
}